

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeIndexMoveto(BtCursor *pCur,UnpackedRecord *pIdxKey,int *pRes)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  KeyInfo *pKVar7;
  anon_union_8_2_94730112_for_u *paVar8;
  BtCursor *pCur_00;
  MemPage *pMVar9;
  u8 *puVar10;
  int iVar11;
  byte *pbVar12;
  uchar *pBuf;
  long lVar13;
  ulong uVar14;
  undefined8 uVar15;
  u16 uVar16;
  int iVar17;
  int iVar18;
  i8 iVar19;
  i8 iVar20;
  uint uVar21;
  int iVar22;
  u32 amt;
  code *xRecordCompare;
  
  pKVar7 = pIdxKey->pKeyInfo;
  xRecordCompare = sqlite3VdbeRecordCompare;
  if (pKVar7->nAllField < 0xe) {
    paVar8 = (anon_union_8_2_94730112_for_u *)pIdxKey->aMem;
    uVar6 = *(u16 *)((long)paVar8 + 0x14);
    if (*pKVar7->aSortFlags == 0) {
      iVar19 = '\x01';
      iVar20 = -1;
    }
    else {
      if ((*pKVar7->aSortFlags & 2) != 0) goto LAB_00142616;
      iVar19 = -1;
      iVar20 = '\x01';
    }
    pIdxKey->r1 = iVar20;
    pIdxKey->r2 = iVar19;
    if ((uVar6 & 4) == 0) {
      if (((uVar6 & 0x39) == 0) && (pKVar7->aColl[0] == (CollSeq *)0x0)) {
        pIdxKey->u = paVar8[1];
        pIdxKey->n = *(int *)(paVar8 + 2);
        xRecordCompare = vdbeRecordCompareString;
      }
    }
    else {
      pIdxKey->u = *paVar8;
      xRecordCompare = vdbeRecordCompareInt;
    }
  }
LAB_00142616:
  pIdxKey->errCode = '\0';
  if ((pCur->eState == '\0') &&
     (pCur_00 = (BtCursor *)pCur->pPage, *(char *)&pCur_00->pBtree != '\0')) {
    if (0 < (long)pCur->iPage) {
      lVar13 = 0;
      do {
        if (pCur->aiIdx[lVar13] < pCur->apPage[lVar13]->nCell) goto LAB_00142622;
        lVar13 = lVar13 + 1;
      } while (pCur->iPage != lVar13);
    }
    if (((*(ushort *)&pCur_00->pKey - 1 == (uint)pCur->ix) &&
        (iVar11 = indexCellCompare(pCur_00,(uint)pCur->ix,pIdxKey,xRecordCompare), iVar11 < 1)) &&
       (pIdxKey->errCode == '\0')) {
      *pRes = iVar11;
      return 0;
    }
    if ((('\0' < pCur->iPage) &&
        (iVar11 = indexCellCompare((BtCursor *)pCur->pPage,0,pIdxKey,xRecordCompare), iVar11 < 1))
       && (pIdxKey->errCode == '\0')) {
      pCur->curFlags = pCur->curFlags & 0xfb;
      if (pCur->pPage->isInit == '\0') {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11bff,
                    "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        return 0xb;
      }
      goto LAB_001426eb;
    }
    pIdxKey->errCode = '\0';
  }
LAB_00142622:
  iVar11 = moveToRoot(pCur);
  if (iVar11 != 0) {
    if (iVar11 == 0x10) {
      *pRes = -1;
      return 0;
    }
    return iVar11;
  }
LAB_001426eb:
LAB_00142703:
  pMVar9 = pCur->pPage;
  iVar17 = pMVar9->nCell - 1;
  iVar22 = 0;
  iVar11 = iVar17;
  do {
    puVar10 = pMVar9->aDataOfst;
    iVar18 = iVar17 >> 1;
    uVar14 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)iVar17 & 0xfffffffffffffffeU],
                              pMVar9->aCellIdx[((long)iVar17 & 0xfffffffffffffffeU) + 1]) &
                    pMVar9->maskPage);
    pbVar12 = puVar10 + uVar14 + 1;
    bVar2 = puVar10[uVar14];
    uVar21 = (uint)bVar2;
    uVar16 = (u16)iVar18;
    if (pMVar9->max1bytePayload < bVar2) {
      if ((-1 < (char)*pbVar12) &&
         (uVar21 = (bVar2 & 0x7f) << 7 | (int)(char)*pbVar12, uVar21 <= pMVar9->maxLocal)) {
        pbVar12 = puVar10 + uVar14 + 2;
        goto LAB_00142841;
      }
      (*pMVar9->xParseCell)(pMVar9,puVar10 + (uVar14 - pMVar9->childPtrSize),&pCur->info);
      uVar14 = (pCur->info).nKey;
      amt = (u32)uVar14;
      if (((int)amt < 2) ||
         (pCur->pBt->nPage < (uint)((uVar14 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
        uVar15 = 0x11c56;
LAB_00142950:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar15,
                    "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        iVar17 = 0xb;
      }
      else {
        pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
        if (pBuf == (uchar *)0x0) {
          iVar17 = 7;
        }
        else {
          pCur->ix = uVar16;
          iVar17 = accessPayload(pCur,0,amt,pBuf,0);
          puVar1 = pBuf + (amt & 0x7fffffff);
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[0] = '\0';
          (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[1] = '\0';
          pCur->curFlags = pCur->curFlags & 0xfb;
          if (iVar17 == 0) {
            iVar17 = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
            sqlite3_free(pBuf);
            goto LAB_0014284a;
          }
          sqlite3_free(pBuf);
        }
      }
      goto LAB_0014298e;
    }
LAB_00142841:
    iVar17 = (*xRecordCompare)(uVar21,pbVar12,pIdxKey);
LAB_0014284a:
    if (iVar17 < 0) {
      iVar22 = iVar18 + 1;
    }
    else {
      if (iVar17 == 0) {
        *pRes = 0;
        pCur->ix = uVar16;
        if (pIdxKey->errCode != '\0') {
          uVar15 = 0x11c76;
          goto LAB_00142950;
        }
        goto LAB_0014298c;
      }
      iVar11 = iVar18 + -1;
    }
    if (iVar11 < iVar22) break;
    iVar17 = iVar22 + iVar11;
  } while( true );
  if (pMVar9->leaf != '\0') {
    pCur->ix = uVar16;
    *pRes = iVar17;
LAB_0014298c:
    iVar17 = 0;
    goto LAB_0014298e;
  }
  if (iVar22 < (int)(uint)pMVar9->nCell) {
    lVar13 = (ulong)(CONCAT11(pMVar9->aCellIdx[(long)iVar22 * 2],
                              pMVar9->aCellIdx[(long)iVar22 * 2 + 1]) & pMVar9->maskPage) + 3;
  }
  else {
    lVar13 = (ulong)pMVar9->hdrOffset + 0xb;
  }
  pbVar12 = pMVar9->aData + lVar13;
  bVar2 = pbVar12[-3];
  bVar3 = pbVar12[-2];
  bVar4 = pbVar12[-1];
  bVar5 = *pbVar12;
  pCur->ix = (u16)iVar22;
  iVar17 = moveToChild(pCur,(uint)bVar5 |
                            (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18);
  if (iVar17 != 0) {
LAB_0014298e:
    (pCur->info).nSize = 0;
    return iVar17;
  }
  goto LAB_00142703;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIndexMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo!=0 );

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = 0;
  assert( pIdxKey->default_rc==1
       || pIdxKey->default_rc==0
       || pIdxKey->default_rc==-1
  );


  /* Check to see if we can skip a lot of work.  Two cases:
  **
  **    (1) If the cursor is already pointing to the very last cell
  **        in the table and the pIdxKey search key is greater than or
  **        equal to that last cell, then no movement is required.
  **
  **    (2) If the cursor is on the last page of the table and the first
  **        cell on that last page is less than or equal to the pIdxKey
  **        search key, then we can start the search on the current page
  **        without needing to go back to root.
  */
  if( pCur->eState==CURSOR_VALID
   && pCur->pPage->leaf
   && cursorOnLastPage(pCur)
  ){
    int c;
    if( pCur->ix==pCur->pPage->nCell-1
     && (c = indexCellCompare(pCur, pCur->ix, pIdxKey, xRecordCompare))<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      *pRes = c;
      return SQLITE_OK;  /* Cursor already pointing at the correct spot */
    }
    if( pCur->iPage>0
     && indexCellCompare(pCur, 0, pIdxKey, xRecordCompare)<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      pCur->curFlags &= ~BTCF_ValidOvfl;
      if( !pCur->pPage->isInit ){
        return SQLITE_CORRUPT_BKPT;
      }
      goto bypass_moveto_root;  /* Start search on the current page */
    }
    pIdxKey->errCode = SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }

bypass_moveto_root:
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->curIntKey==0 );
  assert( pIdxKey!=0 );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==0 );
    lwr = 0;
    upr = pPage->nCell-1;
    idx = upr>>1; /* idx = (lwr+upr)/2; */
    for(;;){
      int nCell;  /* Size of the pCell cell in bytes */
      pCell = findCellPastPtr(pPage, idx);

      /* The maximum supported page-size is 65536 bytes. This means that
      ** the maximum number of record bytes stored on an index B-Tree
      ** page is less than 16384 bytes and may be stored as a 2-byte
      ** varint. This information is used to attempt to avoid parsing
      ** the entire cell by checking for the cases where the record is
      ** stored entirely within the b-tree page by inspecting the first
      ** 2 bytes of the cell.
      */
      nCell = pCell[0];
      if( nCell<=pPage->max1bytePayload ){
        /* This branch runs if the record-size field of the cell is a
        ** single byte varint and the record fits entirely on the main
        ** b-tree page.  */
        testcase( pCell+nCell+1==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
      }else if( !(pCell[1] & 0x80)
        && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
      ){
        /* The record-size field is a 2 byte varint and the record
        ** fits entirely on the main b-tree page.  */
        testcase( pCell+nCell+2==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
      }else{
        /* The record flows over onto one or more overflow pages. In
        ** this case the whole cell needs to be parsed, a buffer allocated
        ** and accessPayload() used to retrieve the record into the
        ** buffer before VdbeRecordCompare() can be called.
        **
        ** If the record is corrupt, the xRecordCompare routine may read
        ** up to two varints past the end of the buffer. An extra 18
        ** bytes of padding is allocated at the end of the buffer in
        ** case this happens.  */
        void *pCellKey;
        u8 * const pCellBody = pCell - pPage->childPtrSize;
        const int nOverrun = 18;  /* Size of the overrun padding */
        pPage->xParseCell(pPage, pCellBody, &pCur->info);
        nCell = (int)pCur->info.nKey;
        testcase( nCell<0 );   /* True if key size is 2^32 or more */
        testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
        testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
        testcase( nCell==2 );  /* Minimum legal index key size */
        if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
          rc = SQLITE_CORRUPT_PAGE(pPage);
          goto moveto_index_finish;
        }
        pCellKey = sqlite3Malloc( nCell+nOverrun );
        if( pCellKey==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto moveto_index_finish;
        }
        pCur->ix = (u16)idx;
        rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
        memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
        pCur->curFlags &= ~BTCF_ValidOvfl;
        if( rc ){
          sqlite3_free(pCellKey);
          goto moveto_index_finish;
        }
        c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
        sqlite3_free(pCellKey);
      }
      assert(
          (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
       && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
      );
      if( c<0 ){
        lwr = idx+1;
      }else if( c>0 ){
        upr = idx-1;
      }else{
        assert( c==0 );
        *pRes = 0;
        rc = SQLITE_OK;
        pCur->ix = (u16)idx;
        if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
        goto moveto_index_finish;
      }
      if( lwr>upr ) break;
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell || CORRUPT_DB );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_index_finish;
    }
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_index_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}